

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::RenderCheckMark(ImVec2 pos,ImU32 col,float sz)

{
  int *piVar1;
  ImGuiWindow *pIVar2;
  ImDrawList *pIVar3;
  ImVec2 *pIVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  int iVar7;
  ImGuiContext *ctx;
  ImVec2 *pIVar8;
  int iVar9;
  int iVar10;
  float fVar11;
  float thickness;
  float fVar12;
  float fVar13;
  
  thickness = sz / 5.0;
  pIVar2 = GImGui->CurrentWindow;
  if (thickness <= 1.0) {
    thickness = 1.0;
  }
  fVar11 = sz - thickness * 0.5;
  fVar12 = fVar11 / 3.0;
  fVar13 = pos.x + thickness * 0.25 + fVar12;
  fVar11 = (pos.y + thickness * 0.25 + fVar11) - fVar12 * 0.5;
  pIVar3 = pIVar2->DrawList;
  iVar7 = (pIVar3->_Path).Size;
  if (iVar7 == (pIVar3->_Path).Capacity) {
    if (iVar7 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar7 / 2 + iVar7;
    }
    iVar10 = iVar7 + 1;
    if (iVar7 + 1 < iVar9) {
      iVar10 = iVar9;
    }
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
    pIVar8 = (ImVec2 *)(*GImAllocatorAllocFunc)((long)iVar10 << 3,GImAllocatorUserData);
    pIVar4 = (pIVar3->_Path).Data;
    if (pIVar4 != (ImVec2 *)0x0) {
      memcpy(pIVar8,pIVar4,(long)(pIVar3->_Path).Size << 3);
      pIVar4 = (pIVar3->_Path).Data;
      if ((pIVar4 != (ImVec2 *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
    }
    (pIVar3->_Path).Data = pIVar8;
    (pIVar3->_Path).Capacity = iVar10;
    iVar7 = (pIVar3->_Path).Size;
  }
  else {
    pIVar8 = (pIVar3->_Path).Data;
  }
  IVar6.y = fVar11 - fVar12;
  IVar6.x = fVar13 - fVar12;
  pIVar8[iVar7] = IVar6;
  (pIVar3->_Path).Size = (pIVar3->_Path).Size + 1;
  pIVar3 = pIVar2->DrawList;
  iVar7 = (pIVar3->_Path).Size;
  if (iVar7 == (pIVar3->_Path).Capacity) {
    if (iVar7 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar7 / 2 + iVar7;
    }
    iVar10 = iVar7 + 1;
    if (iVar7 + 1 < iVar9) {
      iVar10 = iVar9;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    pIVar8 = (ImVec2 *)(*GImAllocatorAllocFunc)((long)iVar10 << 3,GImAllocatorUserData);
    pIVar4 = (pIVar3->_Path).Data;
    if (pIVar4 != (ImVec2 *)0x0) {
      memcpy(pIVar8,pIVar4,(long)(pIVar3->_Path).Size << 3);
      pIVar4 = (pIVar3->_Path).Data;
      if ((pIVar4 != (ImVec2 *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
    }
    (pIVar3->_Path).Data = pIVar8;
    (pIVar3->_Path).Capacity = iVar10;
    iVar7 = (pIVar3->_Path).Size;
  }
  else {
    pIVar8 = (pIVar3->_Path).Data;
  }
  pIVar8[iVar7].x = fVar13;
  pIVar8[iVar7].y = fVar11;
  (pIVar3->_Path).Size = (pIVar3->_Path).Size + 1;
  pIVar3 = pIVar2->DrawList;
  iVar7 = (pIVar3->_Path).Size;
  if (iVar7 == (pIVar3->_Path).Capacity) {
    if (iVar7 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar7 / 2 + iVar7;
    }
    iVar10 = iVar7 + 1;
    if (iVar7 + 1 < iVar9) {
      iVar10 = iVar9;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    pIVar8 = (ImVec2 *)(*GImAllocatorAllocFunc)((long)iVar10 << 3,GImAllocatorUserData);
    pIVar4 = (pIVar3->_Path).Data;
    if (pIVar4 != (ImVec2 *)0x0) {
      memcpy(pIVar8,pIVar4,(long)(pIVar3->_Path).Size << 3);
      pIVar4 = (pIVar3->_Path).Data;
      if ((pIVar4 != (ImVec2 *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
    }
    (pIVar3->_Path).Data = pIVar8;
    (pIVar3->_Path).Capacity = iVar10;
    iVar7 = (pIVar3->_Path).Size;
  }
  else {
    pIVar8 = (pIVar3->_Path).Data;
  }
  IVar5.y = -fVar12 + -fVar12 + fVar11;
  IVar5.x = fVar12 + fVar12 + fVar13;
  pIVar8[iVar7] = IVar5;
  (pIVar3->_Path).Size = (pIVar3->_Path).Size + 1;
  pIVar3 = pIVar2->DrawList;
  ImDrawList::AddPolyline(pIVar3,(pIVar3->_Path).Data,(pIVar3->_Path).Size,col,false,thickness);
  (pIVar3->_Path).Size = 0;
  return;
}

Assistant:

void ImGui::RenderCheckMark(ImVec2 pos, ImU32 col, float sz)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    float thickness = ImMax(sz / 5.0f, 1.0f);
    sz -= thickness*0.5f;
    pos += ImVec2(thickness*0.25f, thickness*0.25f);

    float third = sz / 3.0f;
    float bx = pos.x + third;
    float by = pos.y + sz - third*0.5f;
    window->DrawList->PathLineTo(ImVec2(bx - third, by - third));
    window->DrawList->PathLineTo(ImVec2(bx, by));
    window->DrawList->PathLineTo(ImVec2(bx + third*2, by - third*2));
    window->DrawList->PathStroke(col, false, thickness);
}